

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool __thiscall ON_CheckSum::Write(ON_CheckSum *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  uchar b [48];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar2 < 4) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    bVar1 = ON_BinaryArchive::WriteByte(archive,0x30,&local_48);
  }
  else {
    bVar1 = ON_BinaryArchive::WriteBigSize(archive,this->m_size);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteBigTime(archive,this->m_time);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteInt(archive,8,this->m_crc);
        return bVar1;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_CheckSum::Write(ON_BinaryArchive& archive) const
{
  bool rc = false;
  if ( archive.Archive3dmVersion() < 4 )
  {
    // V3 files had other information
    // 48 bytes of zeros will work ok
    unsigned char b[48];
    memset(b,0,sizeof(b));
    rc = archive.WriteByte(48,b);
  }
  else
  {
    rc = archive.WriteBigSize(m_size);
    if (rc)
      rc = archive.WriteBigTime(m_time);
    if (rc)
      rc = archive.WriteInt(8,&m_crc[0]);
  }
  return rc;
}